

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.h
# Opt level: O1

int GetUBXPacketublox(UBLOX *publox,UBXDATA *pUBXData)

{
  ushort uVar1;
  UBLOX *pUVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ssize_t sVar6;
  long lVar7;
  __time_t _Var8;
  uchar CK_B;
  uchar uVar9;
  int packetlen;
  long *plVar10;
  int i;
  long lVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uchar uVar16;
  int iVar17;
  uchar *puVar18;
  CHRONO chrono;
  uchar recvbuf [4096];
  uint local_10ac;
  timespec local_10a8;
  ulong local_1098;
  UBXDATA *local_1090;
  UBLOX *local_1088;
  timespec local_1080;
  undefined8 local_1070;
  undefined8 uStack_1068;
  long local_1060;
  long lStack_1058;
  timespec local_1050;
  int local_1040;
  uchar local_1038 [4104];
  
  iVar3 = clock_getres(4,&local_1050);
  if ((iVar3 == 0) && (iVar3 = clock_gettime(4,&local_1080), iVar3 == 0)) {
    local_1040 = 0;
    local_1070 = 0;
    uStack_1068 = 0;
    local_1060 = 0;
    lStack_1058 = 0;
  }
  uVar15 = 0;
  memset(local_1038,0,0x1000);
  iVar3 = (publox->RS232Port).DevType;
  if (iVar3 - 1U < 4) {
    iVar3 = (publox->RS232Port).s;
    do {
      sVar6 = recv(iVar3,local_1038 + uVar15,(long)(8 - (int)uVar15),0);
      if ((int)sVar6 < 1) goto LAB_00118506;
      uVar13 = (int)uVar15 + (int)sVar6;
      uVar15 = (ulong)uVar13;
    } while ((int)uVar13 < 8);
  }
  else {
    if (iVar3 != 0) {
LAB_00118506:
      puts("Error reading data from a ublox. ");
      return 1;
    }
    iVar3 = *(int *)&(publox->RS232Port).hDev;
    uVar15 = 0;
    do {
      sVar6 = read(iVar3,local_1038 + uVar15,(ulong)(8 - (int)uVar15));
      if ((int)sVar6 < 1) goto LAB_00118506;
      uVar13 = (int)uVar15 + (int)sVar6;
      uVar15 = (ulong)uVar13;
    } while (uVar13 < 8);
  }
  local_1090 = pUBXData;
  if ((publox->bSaveRawData != 0) && ((FILE *)publox->pfSaveFile != (FILE *)0x0)) {
    fwrite(local_1038,8,1,(FILE *)publox->pfSaveFile);
    fflush((FILE *)publox->pfSaveFile);
  }
  iVar3 = 8;
  local_1098 = 0;
  local_10ac = 0;
  local_1088 = publox;
  do {
    uVar13 = 0;
    puVar18 = local_1038;
    do {
      iVar4 = iVar3 - uVar13;
      if (iVar4 < 8) {
        iVar17 = 6;
        packetlen = 0;
        uVar5 = 0;
        uVar12 = 8 - iVar4;
      }
      else {
        iVar17 = 1;
        uVar12 = 0xffffffff;
        packetlen = 0;
        if ((*puVar18 == 0xb5) && (puVar18[1] == 'b')) {
          local_1098 = (ulong)puVar18[2];
          local_10ac = (uint)puVar18[3];
          uVar1 = *(ushort *)(puVar18 + 4);
          packetlen = uVar1 + 8;
          if (packetlen - iVar4 == 0 || packetlen < iVar4) {
            lVar7 = (ulong)uVar1 + 6;
            lVar11 = 2;
            uVar9 = '\0';
            uVar16 = '\0';
            do {
              uVar16 = uVar16 + puVar18[lVar11];
              uVar9 = uVar9 + uVar16;
              lVar11 = lVar11 + 1;
            } while (lVar7 != lVar11);
            if ((puVar18[lVar7] == uVar16) && (uVar5 = 0, puVar18[(ulong)uVar1 + 7] == uVar9)) {
              iVar17 = 0;
            }
            else {
              puts("Warning : UBX checksum error. ");
              uVar5 = 2;
            }
          }
          else {
            iVar17 = 6;
            uVar5 = 0;
            uVar12 = packetlen - iVar4;
          }
        }
        else {
          uVar5 = 1;
        }
      }
      uVar14 = 0xffffffff;
      if ((iVar17 == 0) || (uVar14 = uVar12, iVar17 == 6)) goto LAB_001182f2;
      puVar18 = puVar18 + uVar5;
      uVar13 = uVar13 + uVar5;
    } while ((int)uVar13 < iVar3);
    iVar17 = 1;
    puVar18 = (uchar *)0x0;
    uVar14 = 0xffffffff;
LAB_001182f2:
    if (iVar17 == 1) {
      uVar14 = 8;
      if ((int)uVar13 < 8) {
        uVar14 = uVar13;
      }
    }
    else if (iVar17 == 0) {
      if (0 < (int)(iVar3 - (uVar13 + packetlen))) {
        puts("Warning getting data from a ublox : Unexpected data after a packet. ");
      }
      iVar3 = ProcessPacketUBX(puVar18,packetlen,(int)local_1098,local_10ac,local_1090);
      return (uint)(iVar3 != 0);
    }
    iVar4 = iVar3 - uVar13;
    memmove(local_1038,local_1038 + (int)uVar13,(long)iVar4);
    pUVar2 = local_1088;
    iVar3 = iVar4 + uVar14;
    if (0xfff < iVar3) {
      puts("Error reading data from a ublox : Invalid data. ");
      return 4;
    }
    puVar18 = local_1038 + iVar4;
    iVar4 = (local_1088->RS232Port).DevType;
    if (iVar4 - 1U < 4) {
      if (0 < (int)uVar14) {
        iVar4 = (local_1088->RS232Port).s;
        uVar13 = 0;
        do {
          sVar6 = recv(iVar4,puVar18 + uVar13,(long)(int)(uVar14 - uVar13),0);
          if ((int)sVar6 < 1) goto LAB_00118506;
          uVar13 = uVar13 + (int)sVar6;
        } while ((int)uVar13 < (int)uVar14);
      }
    }
    else {
      if (iVar4 != 0) goto LAB_00118506;
      if (uVar14 != 0) {
        iVar4 = *(int *)&(local_1088->RS232Port).hDev;
        uVar13 = 0;
        do {
          sVar6 = read(iVar4,puVar18 + uVar13,(ulong)(uVar14 - uVar13));
          if ((int)sVar6 < 1) goto LAB_00118506;
          uVar13 = uVar13 + (int)sVar6;
        } while (uVar13 < uVar14);
      }
    }
    if ((pUVar2->bSaveRawData != 0) && ((FILE *)pUVar2->pfSaveFile != (FILE *)0x0)) {
      fwrite(puVar18,(long)(int)uVar14,1,(FILE *)pUVar2->pfSaveFile);
      fflush((FILE *)pUVar2->pfSaveFile);
    }
    if (local_1040 == 0) {
      clock_gettime(4,&local_10a8);
      local_10a8.tv_sec =
           (local_10a8.tv_sec + local_1060 + (local_10a8.tv_nsec + lStack_1058) / 1000000000) -
           local_1080.tv_sec;
      local_10a8.tv_nsec = (local_10a8.tv_nsec + lStack_1058) % 1000000000 - local_1080.tv_nsec;
      if (local_10a8.tv_nsec < 0) {
        local_10a8.tv_sec = local_10a8.tv_sec + local_10a8.tv_nsec / 1000000000 + -1;
        local_10a8.tv_nsec = local_10a8.tv_nsec % 1000000000 + 1000000000;
      }
      plVar10 = &local_10a8.tv_nsec;
      _Var8 = local_10a8.tv_sec;
    }
    else {
      plVar10 = &lStack_1058;
      _Var8 = local_1060;
    }
    if (4.0 < (double)*plVar10 / 1000000000.0 + (double)_Var8) {
      puts("Error reading data from a ublox : Packet timeout. ");
      return 2;
    }
  } while( true );
}

Assistant:

inline int GetUBXPacketublox(UBLOX* publox, UBXDATA* pUBXData)
{
	unsigned char recvbuf[MAX_NB_BYTES_UBLOX];
	int BytesReceived = 0, recvbuflen = 0, res = EXIT_FAILURE, nbBytesToRequest = 0, nbBytesDiscarded = 0;
	unsigned char* ptr = NULL;
	int packetlen = 0;
	int mclass = 0, mid = 0;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = MAX_NB_BYTES_UBLOX-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	// Suppose that there are not so many data to discard.
	// First try to get directly the desired message...

	nbBytesToRequest = MIN_PACKET_LENGTH_UBX;
	if (ReadAllRS232Port(&publox->RS232Port, recvbuf, nbBytesToRequest) != EXIT_SUCCESS)
	{
		printf("Error reading data from a ublox. \n");
		return EXIT_FAILURE;
	}
	if ((publox->bSaveRawData)&&(publox->pfSaveFile))
	{
		fwrite(recvbuf, nbBytesToRequest, 1, publox->pfSaveFile);
		fflush(publox->pfSaveFile);
	}
	BytesReceived += nbBytesToRequest;
	
	for (;;)
	{
		res = FindPacketUBX(recvbuf, BytesReceived, &mclass, &mid, &packetlen, &nbBytesToRequest, &ptr, &nbBytesDiscarded);
		if (res == EXIT_SUCCESS) break;
		if (res == EXIT_FAILURE)
		{
			nbBytesToRequest = min(MIN_PACKET_LENGTH_UBX, nbBytesDiscarded);
		}	
		memmove(recvbuf, recvbuf+nbBytesDiscarded, BytesReceived-nbBytesDiscarded);
		BytesReceived -= nbBytesDiscarded;
		if (BytesReceived+nbBytesToRequest > recvbuflen)
		{
			printf("Error reading data from a ublox : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadAllRS232Port(&publox->RS232Port, recvbuf+BytesReceived, nbBytesToRequest) != EXIT_SUCCESS)
		{
			printf("Error reading data from a ublox. \n");
			return EXIT_FAILURE;
		}
		if ((publox->bSaveRawData)&&(publox->pfSaveFile))
		{
			fwrite(recvbuf+BytesReceived, nbBytesToRequest, 1, publox->pfSaveFile);
			fflush(publox->pfSaveFile);
		}
		BytesReceived += nbBytesToRequest;
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_UBLOX)
		{
			printf("Error reading data from a ublox : Packet timeout. \n");
			return EXIT_TIMEOUT;
		}
	}

	if (BytesReceived-nbBytesDiscarded-packetlen > 0)
	{
		printf("Warning getting data from a ublox : Unexpected data after a packet. \n");
	}

	//// Get data bytes.

	//memset(databuf, 0, databuflen);

	//// Check the number of data bytes before copy.
	//if (databuflen < *ppacketlen)
	//{
	//	printf("Error getting data from a ublox : Too small data buffer. \n");
	//	return EXIT_FAILURE;
	//}

	//// Copy the data bytes of the message.
	//if (*ppacketlen > 0)
	//{
	//	memcpy(databuf, ptr, *ppacketlen);
	//}

	if (ProcessPacketUBX(ptr, packetlen, mclass, mid, pUBXData) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}